

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ida.c
# Opt level: O3

int IDAInit(void *ida_mem,IDAResFn res,sunrealtype t0,N_Vector yy0,N_Vector yp0)

{
  N_Vector_Ops p_Var1;
  undefined8 *puVar2;
  undefined8 *puVar3;
  int iVar4;
  long lVar5;
  SUNNonlinearSolver NLS;
  undefined8 *puVar6;
  undefined8 *puVar7;
  undefined8 *puVar8;
  undefined8 *puVar9;
  int error_code;
  char *msgfmt;
  ulong uVar10;
  int iVar11;
  ulong uVar12;
  sunindextype liw1;
  sunindextype lrw1;
  undefined8 *local_70;
  undefined8 *local_68;
  undefined8 *local_60;
  undefined8 *local_58;
  undefined8 *local_50;
  undefined8 local_40;
  undefined8 local_38;
  
  if (ida_mem == (void *)0x0) {
    msgfmt = "ida_mem = NULL illegal.";
    iVar11 = -0x14;
    ida_mem = (IDAMem)0x0;
    error_code = -0x14;
    iVar4 = 0x183;
    goto LAB_00109e54;
  }
  if (yy0 == (N_Vector)0x0) {
    msgfmt = "y0 = NULL illegal.";
    iVar11 = -0x16;
    error_code = -0x16;
    iVar4 = 0x18e;
    goto LAB_00109e54;
  }
  if (yp0 == (N_Vector)0x0) {
    msgfmt = "yp0 = NULL illegal.";
    iVar11 = -0x16;
    error_code = -0x16;
    iVar4 = 0x196;
    goto LAB_00109e54;
  }
  if (res == (IDAResFn)0x0) {
    msgfmt = "res = NULL illegal.";
    iVar11 = -0x16;
    error_code = -0x16;
    iVar4 = 0x19e;
    goto LAB_00109e54;
  }
  p_Var1 = yy0->ops;
  if ((((((p_Var1->nvclone == (_func_N_Vector_N_Vector *)0x0) ||
         (p_Var1->nvdestroy == (_func_void_N_Vector *)0x0)) ||
        (p_Var1->nvlinearsum == (_func_void_sunrealtype_N_Vector_sunrealtype_N_Vector_N_Vector *)0x0
        )) || ((p_Var1->nvconst == (_func_void_sunrealtype_N_Vector *)0x0 ||
               (p_Var1->nvprod == (_func_void_N_Vector_N_Vector_N_Vector *)0x0)))) ||
      ((p_Var1->nvscale == (_func_void_sunrealtype_N_Vector_N_Vector *)0x0 ||
       ((p_Var1->nvabs == (_func_void_N_Vector_N_Vector *)0x0 ||
        (p_Var1->nvinv == (_func_void_N_Vector_N_Vector *)0x0)))))) ||
     ((p_Var1->nvaddconst == (_func_void_N_Vector_sunrealtype_N_Vector *)0x0 ||
      ((p_Var1->nvwrmsnorm == (_func_sunrealtype_N_Vector_N_Vector *)0x0 ||
       (p_Var1->nvmin == (_func_sunrealtype_N_Vector *)0x0)))))) {
    msgfmt = "A required vector operation is not implemented.";
    iVar11 = -0x16;
    error_code = -0x16;
    iVar4 = 0x1a9;
    goto LAB_00109e54;
  }
  if (p_Var1->nvspace == (_func_void_N_Vector_sunindextype_ptr_sunindextype_ptr *)0x0) {
    local_38 = 0;
    local_40 = 0;
  }
  else {
    N_VSpace(yy0,&local_38,&local_40);
  }
  *(undefined8 *)((long)ida_mem + 0x398) = local_38;
  *(undefined8 *)((long)ida_mem + 0x3a0) = local_40;
  lVar5 = N_VClone(yy0);
  *(long *)((long)ida_mem + 0x180) = lVar5;
  if (lVar5 != 0) {
    puVar7 = (undefined8 *)((long)ida_mem + 0x180);
    lVar5 = N_VClone(yy0);
    *(long *)((long)ida_mem + 0x1c8) = lVar5;
    if (lVar5 != 0) {
      local_70 = (undefined8 *)((long)ida_mem + 0x1c8);
      lVar5 = N_VClone(yy0);
      *(long *)((long)ida_mem + 0x1a8) = lVar5;
      puVar9 = puVar7;
      if (lVar5 != 0) {
        local_68 = (undefined8 *)((long)ida_mem + 0x1a8);
        lVar5 = N_VClone(yy0);
        *(long *)((long)ida_mem + 0x198) = lVar5;
        puVar9 = local_70;
        if (lVar5 != 0) {
          local_60 = (undefined8 *)((long)ida_mem + 0x198);
          lVar5 = N_VClone(yy0);
          *(long *)((long)ida_mem + 0x1a0) = lVar5;
          if (lVar5 != 0) {
            puVar9 = (undefined8 *)((long)ida_mem + 0x1a0);
            lVar5 = N_VClone(yy0);
            *(long *)((long)ida_mem + 0x1c0) = lVar5;
            puVar8 = puVar7;
            puVar6 = local_70;
            puVar2 = local_68;
            puVar3 = local_60;
            if (lVar5 != 0) {
              local_58 = (undefined8 *)((long)ida_mem + 0x1c0);
              lVar5 = N_VClone(yy0);
              *(long *)((long)ida_mem + 0x1d0) = lVar5;
              puVar8 = local_70;
              puVar6 = local_68;
              puVar2 = local_60;
              if (lVar5 != 0) {
                lVar5 = N_VClone(yy0);
                *(long *)((long)ida_mem + 0x1d8) = lVar5;
                puVar6 = puVar7;
                puVar2 = local_68;
                puVar3 = local_60;
                local_50 = (undefined8 *)((long)ida_mem + 0x1d0);
                if (lVar5 != 0) {
                  lVar5 = N_VClone(yy0);
                  *(long *)((long)ida_mem + 0x1e0) = lVar5;
                  if (lVar5 != 0) {
                    iVar4 = 3;
                    if (3 < *(int *)((long)ida_mem + 0x308)) {
                      iVar4 = *(int *)((long)ida_mem + 0x308);
                    }
                    uVar10 = 0;
                    while( true ) {
                      lVar5 = N_VClone(yy0);
                      *(long *)((long)ida_mem + uVar10 * 8 + 0x60) = lVar5;
                      if (lVar5 == 0) break;
                      uVar10 = uVar10 + 1;
                      if (iVar4 + 1 == uVar10) {
                        *(long *)((long)ida_mem + 0x3a8) =
                             *(long *)((long)ida_mem + 0x3a8) +
                             *(long *)((long)ida_mem + 0x398) * (ulong)(iVar4 + 10);
                        *(long *)((long)ida_mem + 0x3b0) =
                             *(long *)((long)ida_mem + 0x3b0) +
                             (ulong)(iVar4 + 10) * *(long *)((long)ida_mem + 0x3a0);
                        *(undefined4 *)((long)ida_mem + 0x30c) =
                             *(undefined4 *)((long)ida_mem + 0x308);
                        *(IDAResFn *)((long)ida_mem + 0x10) = res;
                        *(sunrealtype *)((long)ida_mem + 0x2a8) = t0;
                        N_VScale(0,yy0,*(undefined8 *)((long)ida_mem + 0x60));
                        N_VScale(0,yp0,*(undefined8 *)((long)ida_mem + 0x68));
                        NLS = SUNNonlinSol_Newton(yy0,*ida_mem);
                        if (NLS == (SUNNonlinearSolver)0x0) {
                          IDAProcessError((IDAMem)ida_mem,-0x15,0x1d5,"IDAInit",
                                          "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/ida/ida.c"
                                          ,"A memory request failed.");
                          IDAFreeVectors((IDAMem)ida_mem);
                          return -0x15;
                        }
                        iVar4 = IDASetNonlinearSolver(ida_mem,NLS);
                        if (iVar4 != 0) {
                          IDAProcessError((IDAMem)ida_mem,iVar4,0x1e2,"IDAInit",
                                          "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/ida/ida.c"
                                          ,"Setting the nonlinear solver failed");
                          IDAFreeVectors((IDAMem)ida_mem);
                          SUNNonlinSolFree(NLS);
                          return -0x15;
                        }
                        *(undefined4 *)((long)ida_mem + 0x3e0) = 1;
                        *(undefined4 *)((long)ida_mem + 0x26c) = 0;
                        *(undefined8 *)((long)ida_mem + 0x298) = 0;
                        *(undefined8 *)((long)ida_mem + 0x360) = 0;
                        *(undefined8 *)((long)ida_mem + 0x368) = 0;
                        *(undefined8 *)((long)ida_mem + 0x370) = 0;
                        *(undefined8 *)((long)ida_mem + 0x378) = 0;
                        *(undefined8 *)((long)ida_mem + 0x380) = 0;
                        *(undefined8 *)((long)ida_mem + 0x388) = 0;
                        *(undefined8 *)((long)ida_mem + 0x390) = 0;
                        *(undefined8 *)((long)ida_mem + 0x3f0) = 0;
                        *(undefined8 *)((long)ida_mem + 0x3f8) = 0;
                        *(undefined8 *)((long)ida_mem + 0x400) = 0;
                        *(undefined8 *)((long)ida_mem + 0x408) = 0;
                        *(undefined8 *)((long)ida_mem + 0x410) = 0;
                        *(undefined8 *)((long)ida_mem + 0x418) = 0;
                        *(undefined8 *)((long)ida_mem + 0x3b8) = 0x3ff0000000000000;
                        *(undefined4 *)((long)ida_mem + 0x234) = 0;
                        *(undefined8 *)((long)ida_mem + 0x430) = 0;
                        *(undefined4 *)((long)ida_mem + 0x438) = 0;
                        *(undefined8 *)((long)ida_mem + 0x440) = 0;
                        *(undefined8 *)((long)ida_mem + 0x448) = 0;
                        *(undefined8 *)((long)ida_mem + 0x468) = 0;
                        *(undefined8 *)((long)ida_mem + 0x470) = 0;
                        *(undefined8 *)((long)ida_mem + 0x478) = 0;
                        *(undefined4 *)((long)ida_mem + 0x4a4) = 0;
                        *(undefined8 *)((long)ida_mem + 0x494) = 0;
                        *(undefined8 *)((long)ida_mem + 0x49c) = 0;
                        *(undefined4 *)((long)ida_mem + 0x4a8) = 1;
                        *(undefined4 *)((long)ida_mem + 0x3c0) = 0;
                        *(undefined4 *)((long)ida_mem + 0x3d0) = 1;
                        return 0;
                      }
                    }
                    N_VDestroy(*(undefined8 *)((long)ida_mem + 0x180));
                    N_VDestroy(*(undefined8 *)((long)ida_mem + 0x1c8));
                    N_VDestroy(*(undefined8 *)((long)ida_mem + 0x1a8));
                    N_VDestroy(*(undefined8 *)((long)ida_mem + 0x198));
                    N_VDestroy(*(undefined8 *)((long)ida_mem + 0x1a0));
                    N_VDestroy(*(undefined8 *)((long)ida_mem + 0x1c0));
                    N_VDestroy(*(undefined8 *)((long)ida_mem + 0x1d0));
                    N_VDestroy(*(undefined8 *)((long)ida_mem + 0x1d8));
                    N_VDestroy(*(undefined8 *)((long)ida_mem + 0x1e0));
                    if (uVar10 != 0) {
                      uVar12 = 0;
                      do {
                        N_VDestroy(*(undefined8 *)((long)ida_mem + uVar12 * 8 + 0x60));
                        uVar12 = uVar12 + 1;
                      } while (uVar10 != uVar12);
                    }
                    goto LAB_0010a1d6;
                  }
                  local_50 = (undefined8 *)((long)ida_mem + 0x1d8);
                  N_VDestroy(*puVar7);
                  puVar6 = local_70;
                  puVar8 = local_68;
                  puVar2 = local_60;
                  puVar3 = puVar9;
                  puVar9 = local_58;
                  local_58 = (undefined8 *)((long)ida_mem + 0x1d0);
                }
                local_60 = puVar9;
                local_68 = puVar3;
                local_70 = puVar2;
                puVar7 = puVar8;
                puVar8 = local_70;
                N_VDestroy(*puVar6);
                local_70 = local_68;
                local_68 = local_60;
                local_60 = local_58;
                local_58 = local_50;
                puVar6 = local_70;
                puVar2 = local_68;
                puVar9 = local_60;
              }
              local_60 = puVar9;
              local_68 = puVar2;
              local_70 = puVar6;
              puVar6 = local_70;
              N_VDestroy(*puVar7);
              local_70 = local_68;
              local_68 = local_60;
              local_60 = local_58;
              puVar2 = local_70;
              puVar3 = local_68;
              puVar9 = local_60;
            }
            local_60 = puVar9;
            local_68 = puVar3;
            local_70 = puVar2;
            puVar7 = puVar6;
            N_VDestroy(*puVar8);
          }
          N_VDestroy(*puVar7);
          puVar7 = local_70;
          puVar9 = local_68;
          local_68 = local_60;
        }
        N_VDestroy(*puVar7);
        local_70 = local_68;
      }
      puVar7 = local_70;
      N_VDestroy(*puVar9);
    }
    N_VDestroy(*puVar7);
  }
LAB_0010a1d6:
  msgfmt = "A memory request failed.";
  iVar11 = -0x15;
  error_code = -0x15;
  iVar4 = 0x1bf;
LAB_00109e54:
  IDAProcessError((IDAMem)ida_mem,error_code,iVar4,"IDAInit",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/ida/ida.c"
                  ,msgfmt);
  return iVar11;
}

Assistant:

int IDAInit(void* ida_mem, IDAResFn res, sunrealtype t0, N_Vector yy0,
            N_Vector yp0)
{
  int retval;
  IDAMem IDA_mem;
  sunbooleantype nvectorOK, allocOK;
  sunindextype lrw1, liw1;
  SUNNonlinearSolver NLS;

  /* Check ida_mem */

  if (ida_mem == NULL)
  {
    IDAProcessError(NULL, IDA_MEM_NULL, __LINE__, __func__, __FILE__, MSG_NO_MEM);
    return (IDA_MEM_NULL);
  }
  IDA_mem = (IDAMem)ida_mem;

  SUNDIALS_MARK_FUNCTION_BEGIN(IDA_PROFILER);

  /* Check for legal input parameters */

  if (yy0 == NULL)
  {
    IDAProcessError(IDA_mem, IDA_ILL_INPUT, __LINE__, __func__, __FILE__,
                    MSG_Y0_NULL);
    SUNDIALS_MARK_FUNCTION_END(IDA_PROFILER);
    return (IDA_ILL_INPUT);
  }

  if (yp0 == NULL)
  {
    IDAProcessError(IDA_mem, IDA_ILL_INPUT, __LINE__, __func__, __FILE__,
                    MSG_YP0_NULL);
    SUNDIALS_MARK_FUNCTION_END(IDA_PROFILER);
    return (IDA_ILL_INPUT);
  }

  if (res == NULL)
  {
    IDAProcessError(IDA_mem, IDA_ILL_INPUT, __LINE__, __func__, __FILE__,
                    MSG_RES_NULL);
    SUNDIALS_MARK_FUNCTION_END(IDA_PROFILER);
    return (IDA_ILL_INPUT);
  }

  /* Test if all required vector operations are implemented */

  nvectorOK = IDACheckNvector(yy0);
  if (!nvectorOK)
  {
    IDAProcessError(IDA_mem, IDA_ILL_INPUT, __LINE__, __func__, __FILE__,
                    MSG_BAD_NVECTOR);
    SUNDIALS_MARK_FUNCTION_END(IDA_PROFILER);
    return (IDA_ILL_INPUT);
  }

  /* Set space requirements for one N_Vector */

  if (yy0->ops->nvspace != NULL) { N_VSpace(yy0, &lrw1, &liw1); }
  else
  {
    lrw1 = 0;
    liw1 = 0;
  }
  IDA_mem->ida_lrw1 = lrw1;
  IDA_mem->ida_liw1 = liw1;

  /* Allocate the vectors (using yy0 as a template) */

  allocOK = IDAAllocVectors(IDA_mem, yy0);
  if (!allocOK)
  {
    IDAProcessError(IDA_mem, IDA_MEM_FAIL, __LINE__, __func__, __FILE__,
                    MSG_MEM_FAIL);
    SUNDIALS_MARK_FUNCTION_END(IDA_PROFILER);
    return (IDA_MEM_FAIL);
  }

  /* Input checks complete at this point and history array allocated */

  /* Copy the input parameters into IDA memory block */
  IDA_mem->ida_res = res;
  IDA_mem->ida_tn  = t0;

  /* Initialize the phi array */
  N_VScale(ONE, yy0, IDA_mem->ida_phi[0]);
  N_VScale(ONE, yp0, IDA_mem->ida_phi[1]);

  /* create a Newton nonlinear solver object by default */
  NLS = SUNNonlinSol_Newton(yy0, IDA_mem->ida_sunctx);

  /* check that nonlinear solver is non-NULL */
  if (NLS == NULL)
  {
    IDAProcessError(IDA_mem, IDA_MEM_FAIL, __LINE__, __func__, __FILE__,
                    MSG_MEM_FAIL);
    IDAFreeVectors(IDA_mem);
    SUNDIALS_MARK_FUNCTION_END(IDA_PROFILER);
    return (IDA_MEM_FAIL);
  }

  /* attach the nonlinear solver to the IDA memory */
  retval = IDASetNonlinearSolver(IDA_mem, NLS);

  /* check that the nonlinear solver was successfully attached */
  if (retval != IDA_SUCCESS)
  {
    IDAProcessError(IDA_mem, retval, __LINE__, __func__, __FILE__,
                    "Setting the nonlinear solver failed");
    IDAFreeVectors(IDA_mem);
    SUNNonlinSolFree(NLS);
    SUNDIALS_MARK_FUNCTION_END(IDA_PROFILER);
    return (IDA_MEM_FAIL);
  }

  /* set ownership flag */
  IDA_mem->ownNLS = SUNTRUE;

  /* All error checking is complete at this point */

  /* Set the linear solver addresses to NULL */

  IDA_mem->ida_linit  = NULL;
  IDA_mem->ida_lsetup = NULL;
  IDA_mem->ida_lsolve = NULL;
  IDA_mem->ida_lperf  = NULL;
  IDA_mem->ida_lfree  = NULL;
  IDA_mem->ida_lmem   = NULL;

  /* Initialize all the counters and other optional output values */

  IDA_mem->ida_nst     = 0;
  IDA_mem->ida_nre     = 0;
  IDA_mem->ida_ncfn    = 0;
  IDA_mem->ida_netf    = 0;
  IDA_mem->ida_nni     = 0;
  IDA_mem->ida_nnf     = 0;
  IDA_mem->ida_nsetups = 0;

  IDA_mem->ida_kused = 0;
  IDA_mem->ida_hused = ZERO;
  IDA_mem->ida_tolsf = ONE;

  IDA_mem->ida_nge = 0;

  IDA_mem->ida_irfnd = 0;

  /* Initialize counters specific to IC calculation. */
  IDA_mem->ida_nbacktr = 0;

  /* Initialize root-finding variables */

  IDA_mem->ida_glo     = NULL;
  IDA_mem->ida_ghi     = NULL;
  IDA_mem->ida_grout   = NULL;
  IDA_mem->ida_iroots  = NULL;
  IDA_mem->ida_rootdir = NULL;
  IDA_mem->ida_gfun    = NULL;
  IDA_mem->ida_nrtfn   = 0;
  IDA_mem->ida_gactive = NULL;
  IDA_mem->ida_mxgnull = 1;

  /* Initial setup not done yet */

  IDA_mem->ida_SetupDone = SUNFALSE;

  /* Problem memory has been successfully allocated */

  IDA_mem->ida_MallocDone = SUNTRUE;

  SUNDIALS_MARK_FUNCTION_END(IDA_PROFILER);
  return (IDA_SUCCESS);
}